

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

bool __thiscall
problem_parser::append_to_objective(problem_parser *this,function_element_token *elem)

{
  size_t sVar1;
  __normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
  _Var2;
  bool bVar3;
  string_view value;
  int id;
  int local_1c;
  
  sVar1 = (elem->name)._M_len;
  if (sVar1 == 0) {
    (this->m_problem).objective.value = elem->factor + (this->m_problem).objective.value;
    bVar3 = true;
  }
  else {
    value._M_str = (elem->name)._M_str;
    value._M_len = sVar1;
    local_1c = get_or_assign_variable(this,value);
    bVar3 = local_1c != -1;
    if (bVar3) {
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<baryonyx::objective_function_element*,std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>,__gnu_cxx::__ops::_Iter_pred<problem_parser::append_to_objective(function_element_token_const&)::_lambda(auto:1_const&)_1_>>
                        ((this->m_problem).objective.elements.
                         super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->m_problem).objective.elements.
                         super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                         ._M_impl.super__Vector_impl_data._M_finish,local_1c);
      if (_Var2._M_current ==
          (this->m_problem).objective.elements.
          super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
        ::emplace_back<double_const&,int&>
                  ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                    *)&(this->m_problem).objective,&elem->factor,&local_1c);
      }
      else {
        (_Var2._M_current)->factor = elem->factor + (_Var2._M_current)->factor;
      }
    }
  }
  return bVar3;
}

Assistant:

[[nodiscard]] bool append_to_objective(const function_element_token& elem)
    {
        if (elem.name.empty()) {
            m_problem.objective.value += elem.factor;
            return true;
        } else {
            auto id = get_or_assign_variable(elem.name);
            if (id == -1)
                return false;

            auto it = std::find_if(
              std::begin(m_problem.objective.elements),
              std::end(m_problem.objective.elements),
              [id](const auto& elem) { return elem.variable_index == id; });

            if (it == std::end(m_problem.objective.elements))
                m_problem.objective.elements.emplace_back(elem.factor, id);
            else
                it->factor += elem.factor;

            return true;
        }
    }